

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stb_uint stb_crc32_block(stb_uint crc,uchar *buffer,stb_uint len)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (stb_crc32_block::crc_table[1] == 0) {
    uVar1 = 0;
    do {
      iVar2 = 8;
      uVar4 = uVar1 & 0xffffffff;
      do {
        uVar3 = -((uint)uVar4 & 1) & 0xedb88320 ^ (uint)(uVar4 >> 1);
        uVar4 = (ulong)uVar3;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      stb_crc32_block::crc_table[uVar1] = uVar3;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x100);
  }
  if (len != 0) {
    uVar3 = ~crc;
    uVar1 = 0;
    do {
      uVar3 = uVar3 >> 8 ^ stb_crc32_block::crc_table[uVar3 & 0xff ^ (uint)buffer[uVar1]];
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
    crc = ~uVar3;
  }
  return crc;
}

Assistant:

stb_uint stb_crc32_block(stb_uint crc, unsigned char *buffer, stb_uint len)
{
   static stb_uint crc_table[256];
   stb_uint i,j,s;
   crc = ~crc;

   if (crc_table[1] == 0)
      for(i=0; i < 256; i++) {
         for (s=i, j=0; j < 8; ++j)
            s = (s >> 1) ^ (s & 1 ? 0xedb88320 : 0);
         crc_table[i] = s;
      }
   for (i=0; i < len; ++i)
      crc = (crc >> 8) ^ crc_table[buffer[i] ^ (crc & 0xff)];
   return ~crc;
}